

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O0

uint8_t * lws_http_multipart_headers(lws *wsi,uint8_t *p)

{
  int iVar1;
  uchar local_68 [4];
  int n;
  char arg [48];
  char local_2a [8];
  char buf [10];
  uint8_t *p_local;
  lws *wsi_local;
  
  buf._2_8_ = p;
  lws_get_random(wsi->context,local_2a,10);
  lws_b64_encode_string(local_2a,10,(wsi->http).multipart_boundary,0x10);
  iVar1 = lws_snprintf((char *)local_68,0x30,"multipart/form-data; boundary=%s",
                       (wsi->http).multipart_boundary);
  iVar1 = lws_add_http_header_by_token
                    (wsi,WSI_TOKEN_HTTP_CONTENT_TYPE,local_68,iVar1,(uchar **)(buf + 2),
                     (uchar *)(buf._2_8_ + 100));
  if (iVar1 == 0) {
    (wsi->http).field_0x88 = (wsi->http).field_0x88 & 0xdf | 0x20;
    (wsi->http).field_0x88 = (wsi->http).field_0x88 & 0xf7 | 8;
    lws_client_http_body_pending(wsi,1);
    wsi_local = (lws *)buf._2_8_;
  }
  else {
    wsi_local = (lws *)0x0;
  }
  return (uint8_t *)wsi_local;
}

Assistant:

uint8_t *
lws_http_multipart_headers(struct lws *wsi, uint8_t *p)
{
	char buf[10], arg[48];
	int n;

	lws_get_random(wsi->context, (uint8_t *)buf, sizeof(buf));
	lws_b64_encode_string(buf, sizeof(buf),
			       wsi->http.multipart_boundary,
			       sizeof(wsi->http.multipart_boundary));

	n = lws_snprintf(arg, sizeof(arg), "multipart/form-data; boundary=%s",
			 wsi->http.multipart_boundary);

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
					 (uint8_t *)arg, n, &p, p + 100))
		return NULL;

	wsi->http.multipart = wsi->http.multipart_issue_boundary = 1;
	lws_client_http_body_pending(wsi, 1);

	return p;
}